

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiter.h
# Opt level: O0

bool __thiscall
jaegertracing::utils::RateLimiter<std::chrono::_V2::steady_clock>::checkCredit
          (RateLimiter<std::chrono::_V2::steady_clock> *this,double itemCost)

{
  bool bVar1;
  rep_conflict rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<double,_std::ratio<1L,_1L>_> local_38;
  duration<double,_std::ratio<1L,_1L>_> elapsedTime;
  time_point currentTime;
  lock_guard<std::mutex> lock;
  double itemCost_local;
  RateLimiter<std::chrono::_V2::steady_clock> *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&currentTime,&this->_mutex);
  elapsedTime.__r = (rep_conflict)std::chrono::_V2::steady_clock::now();
  local_40.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&elapsedTime,&this->_lastTick);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_38,&local_40);
  (this->_lastTick).__d.__r = (rep)elapsedTime.__r;
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_38);
  this->_balance = rVar2 * this->_creditsPerSecond + this->_balance;
  if (this->_maxBalance <= this->_balance && this->_balance != this->_maxBalance) {
    this->_balance = this->_maxBalance;
  }
  bVar1 = itemCost <= this->_balance;
  if (bVar1) {
    this->_balance = this->_balance - itemCost;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&currentTime);
  return bVar1;
}

Assistant:

bool checkCredit(double itemCost)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        const auto currentTime = Clock::now();
        const auto elapsedTime =
            std::chrono::duration<double>(currentTime - _lastTick);
        _lastTick = currentTime;

        _balance += elapsedTime.count() * _creditsPerSecond;
        if (_balance > _maxBalance) {
            _balance = _maxBalance;
        }

        if (_balance >= itemCost) {
            _balance -= itemCost;
            return true;
        }

        return false;
    }